

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O2

void __thiscall Corrade::Utility::Configuration::~Configuration(Configuration *this)

{
  if (((this->_flags)._value & 0x80000) != 0) {
    save(this);
  }
  std::__cxx11::string::~string((string *)&this->_filename);
  ConfigurationGroup::~ConfigurationGroup(&this->super_ConfigurationGroup);
  return;
}

Assistant:

Configuration::~Configuration() { if(_flags & InternalFlag::Changed) save(); }